

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall FBehavior::SerializeVarSet(FBehavior *this,FSerializer *arc,SDWORD *vars,int max)

{
  bool bVar1;
  int local_30;
  int local_2c;
  SDWORD last;
  SDWORD first;
  SDWORD count;
  int max_local;
  SDWORD *vars_local;
  FSerializer *arc_local;
  FBehavior *this_local;
  
  first = max;
  _count = vars;
  vars_local = (SDWORD *)arc;
  arc_local = (FSerializer *)this;
  bVar1 = FSerializer::BeginObject(arc,(char *)0x0);
  if (bVar1) {
    bVar1 = FSerializer::isWriting((FSerializer *)vars_local);
    if (bVar1) {
      for (local_2c = 0; (local_30 = first, local_2c < first && (_count[local_2c] == 0));
          local_2c = local_2c + 1) {
      }
      do {
        local_30 = local_30 + -1;
        if (local_30 < local_2c) break;
      } while (_count[local_30] == 0);
      if (local_30 < local_2c) {
        last = 0;
        FSerializer::operator()((FSerializer *)vars_local,"count",&last);
      }
      else {
        last = (local_30 - local_2c) + 1;
        FSerializer::operator()((FSerializer *)vars_local,"count",&last);
        FSerializer::operator()((FSerializer *)vars_local,"first",&local_2c);
        FSerializer::Array<int>((FSerializer *)vars_local,"values",_count + local_2c,last,false);
      }
    }
    else {
      memset(_count,0,(long)first << 2);
      FSerializer::operator()((FSerializer *)vars_local,"count",&last);
      if (last != 0) {
        FSerializer::operator()((FSerializer *)vars_local,"first",&local_2c);
        if (first < local_2c + last) {
          last = first - local_2c;
        }
        FSerializer::Array<int>((FSerializer *)vars_local,"values",_count + local_2c,last,false);
      }
    }
    FSerializer::EndObject((FSerializer *)vars_local);
  }
  return;
}

Assistant:

void FBehavior::SerializeVarSet (FSerializer &arc, SDWORD *vars, int max)
{
	SDWORD count;
	SDWORD first, last;

	if (arc.BeginObject(nullptr))
	{
		if (arc.isWriting())
		{
			// Find first non-zero variable
			for (first = 0; first < max; ++first)
			{
				if (vars[first] != 0)
				{
					break;
				}
			}

			// Find last non-zero variable
			for (last = max - 1; last >= first; --last)
			{
				if (vars[last] != 0)
				{
					break;
				}
			}

			if (last < first)
			{ // no non-zero variables
				count = 0;
				arc("count", count);
			}
			else
			{
				count = last - first + 1;
				arc("count", count);
				arc("first", first);
				arc.Array("values", &vars[first], count);
			}
		}
		else
		{
			memset(vars, 0, max * sizeof(*vars));
			arc("count", count);

			if (count != 0)
			{
				arc("first", first);
				if (first + count > max) count = max - first;
				arc.Array("values", &vars[first], count);
			}
		}
		arc.EndObject();
	}
}